

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

bool __thiscall ON_String::EqualOrdinal(ON_String *this,char *other_string,bool bOrdinalIgnoreCase)

{
  int element_count1;
  int iVar1;
  char *string1;
  undefined1 local_21;
  int length;
  bool bOrdinalIgnoreCase_local;
  char *other_string_local;
  ON_String *this_local;
  
  element_count1 = Length(this);
  iVar1 = Length(other_string);
  local_21 = false;
  if (element_count1 == iVar1) {
    string1 = operator_cast_to_char_(this);
    local_21 = EqualOrdinal(string1,element_count1,other_string,element_count1,bOrdinalIgnoreCase);
  }
  return local_21;
}

Assistant:

bool ON_String::EqualOrdinal(
  const char* other_string,
  bool bOrdinalIgnoreCase
  ) const
{
  const int length = Length();
  return (length == ON_String::Length(other_string))
    && ON_String::EqualOrdinal(
    static_cast< const char* >(*this),
    length,
    other_string,
    length,
    bOrdinalIgnoreCase
    );
}